

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O3

void __thiscall license::test::MyGlobalFixture::setup(MyGlobalFixture *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 uVar4;
  log_level lVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  path p;
  path pkf;
  path local_100;
  path local_e0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  path local_a0;
  path local_80;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_100.m_pathname._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_100.m_pathname._M_string_length = 0x42914e;
  local_100.m_pathname.field_2._M_allocated_capacity = 0x1d;
  lVar5 = boost::unit_test::unit_test_log_t::operator<<
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&local_100);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_e0,lVar5);
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = &PTR__lazy_ostream_0054ec08;
  local_b0._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0._8_8_ = "setup temp project ";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_e0,(lazy_ostream *)local_c0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_e0);
  boost::filesystem::detail::status((detail *)local_c0,(path *)&project_path,(error_code *)0x0);
  if (1 < (uint)local_c0._0_4_) {
    boost::filesystem::detail::remove_all((path *)&project_path,(error_code *)0x0);
  }
  uVar4 = boost::filesystem::detail::create_directories((path *)&licenses_path,(error_code *)0x0);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x22);
  local_a0.m_pathname._M_dataplus._M_p._0_1_ = uVar4;
  local_a0.m_pathname._M_string_length = 0;
  local_a0.m_pathname.field_2._M_allocated_capacity = 0;
  paVar1 = &local_e0.m_pathname.field_2;
  local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Error creating ","");
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,licenses_path);
  paVar2 = &local_100.m_pathname.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar7) {
    local_100.m_pathname.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_100.m_pathname.field_2._8_4_ = (undefined4)plVar6[3];
    local_100.m_pathname.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_100.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_100.m_pathname.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_100.m_pathname._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_100.m_pathname._M_string_length = plVar6[1];
  *plVar6 = (long)paVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = &PTR__lazy_ostream_0054eb70;
  local_b0._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
  ;
  local_58 = "";
  local_b0._8_8_ = (begin *)&local_100;
  boost::test_tools::tt_detail::report_assertion(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.m_pathname._M_dataplus._M_p);
  }
  paVar7 = &local_a0.m_pathname.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar7->_M_allocated_capacity);
  local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test"
             ,"");
  local_a0.m_pathname._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"data","");
  boost::filesystem::path::operator/=(&local_e0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_pathname._M_dataplus._M_p == paVar1) {
    local_100.m_pathname.field_2._8_4_ = local_e0.m_pathname.field_2._8_4_;
    local_100.m_pathname.field_2._12_4_ = local_e0.m_pathname.field_2._12_4_;
    local_100.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_100.m_pathname._M_dataplus._M_p = local_e0.m_pathname._M_dataplus._M_p;
  }
  local_100.m_pathname.field_2._M_allocated_capacity._4_4_ =
       local_e0.m_pathname.field_2._M_allocated_capacity._4_4_;
  local_100.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_e0.m_pathname.field_2._M_allocated_capacity._0_4_;
  local_100.m_pathname._M_string_length = local_e0.m_pathname._M_string_length;
  local_e0.m_pathname._M_string_length = 0;
  local_e0.m_pathname.field_2._M_allocated_capacity._0_4_ =
       local_e0.m_pathname.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar3 = &local_80.m_pathname.field_2;
  local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  local_80.m_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"private_key.rsa","");
  boost::filesystem::path::operator/=(&local_100,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_pathname._M_dataplus._M_p == paVar2) {
    local_b0._8_8_ =
         CONCAT44(local_100.m_pathname.field_2._12_4_,local_100.m_pathname.field_2._8_4_);
    local_c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_b0;
  }
  else {
    local_c0._0_8_ = local_100.m_pathname._M_dataplus._M_p;
  }
  local_c0._8_8_ = local_100.m_pathname._M_string_length;
  local_100.m_pathname._M_string_length = 0;
  local_100.m_pathname.field_2._M_allocated_capacity =
       local_100.m_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_100.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_80.m_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_100.m_pathname._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_pathname._M_dataplus._M_p != paVar7) {
    operator_delete(local_a0.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.m_pathname._M_dataplus._M_p);
  }
  local_e0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"private_key.rsa","");
  local_100.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,project_path,DAT_0056c1d0 + project_path);
  boost::filesystem::path::operator/=(&local_100,&local_e0);
  boost::filesystem::detail::copy_file((path *)local_c0,&local_100,0,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_100.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    operator_delete((void *)local_c0._0_8_);
  }
  return;
}

Assistant:

void setup() {
		BOOST_TEST_MESSAGE("setup temp project ");
		if (fs::exists(project_path)) {
			fs::remove_all(project_path);
		}
		bool ok = fs::create_directories(licenses_path);
		BOOST_REQUIRE_MESSAGE(ok, string("Error creating ") + licenses_path.string());
		fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
		fs::copy_file(pkf, project_path / PRIVATE_KEY_FNAME);
	}